

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

boolean encode_mcu_AC_first(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  long lVar1;
  int iVar2;
  long *in_RSI;
  long *in_RDI;
  JBLOCKROW block;
  int *natural_order;
  int Al;
  int Se;
  int k;
  int r;
  int nbits;
  int temp2;
  int temp;
  huff_entropy_ptr entropy;
  undefined8 in_stack_ffffffffffffffb8;
  long lVar3;
  huff_entropy_ptr in_stack_ffffffffffffffc0;
  huff_entropy_ptr entropy_00;
  int in_stack_ffffffffffffffc8;
  uint code;
  int iVar4;
  int local_28;
  int local_24;
  int local_1c;
  
  lVar1 = in_RDI[0x46];
  *(undefined8 *)(lVar1 + 200) = *(undefined8 *)in_RDI[5];
  *(undefined8 *)(lVar1 + 0xd0) = *(undefined8 *)(in_RDI[5] + 8);
  if ((*(int *)((long)in_RDI + 0x13c) != 0) && (*(int *)(lVar1 + 0x38) == 0)) {
    emit_restart_e(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  }
  iVar4 = (int)in_RDI[0x3a];
  code = *(uint *)(in_RDI + 0x3b);
  entropy_00 = (huff_entropy_ptr)in_RDI[0x3c];
  lVar3 = *in_RSI;
  local_28 = 0;
  for (iVar2 = *(int *)((long)in_RDI + 0x1cc); iVar2 <= iVar4; iVar2 = iVar2 + 1) {
    local_1c = (int)*(short *)(lVar3 + (long)(entropy_00->saved).last_dc_val[(long)iVar2 + -9] * 2);
    if (local_1c == 0) {
      local_28 = local_28 + 1;
    }
    else {
      if (local_1c < 0) {
        local_1c = -local_1c >> ((byte)code & 0x1f);
      }
      else {
        local_1c = local_1c >> ((byte)code & 0x1f);
      }
      if (local_1c == 0) {
        local_28 = local_28 + 1;
      }
      else {
        if (*(int *)(lVar1 + 0xe4) != 0) {
          emit_eobrun(entropy_00);
        }
        for (; 0xf < local_28; local_28 = local_28 + -0x10) {
          emit_ac_symbol(entropy_00,(int)((ulong)lVar3 >> 0x20),(int)lVar3);
        }
        local_24 = 1;
        while (local_1c = local_1c >> 1, local_1c != 0) {
          local_24 = local_24 + 1;
        }
        if (10 < local_24) {
          *(undefined4 *)(*in_RDI + 0x28) = 6;
          (**(code **)*in_RDI)(in_RDI);
        }
        emit_ac_symbol(entropy_00,(int)((ulong)lVar3 >> 0x20),(int)lVar3);
        emit_bits_e((huff_entropy_ptr)CONCAT44(iVar2,iVar4),code,in_stack_ffffffffffffffc8);
        local_28 = 0;
      }
    }
  }
  if ((0 < local_28) &&
     (*(int *)(lVar1 + 0xe4) = *(int *)(lVar1 + 0xe4) + 1, *(int *)(lVar1 + 0xe4) == 0x7fff)) {
    emit_eobrun(entropy_00);
  }
  *(undefined8 *)in_RDI[5] = *(undefined8 *)(lVar1 + 200);
  *(undefined8 *)(in_RDI[5] + 8) = *(undefined8 *)(lVar1 + 0xd0);
  if (*(int *)((long)in_RDI + 0x13c) != 0) {
    if (*(int *)(lVar1 + 0x38) == 0) {
      *(undefined4 *)(lVar1 + 0x38) = *(undefined4 *)((long)in_RDI + 0x13c);
      *(int *)(lVar1 + 0x3c) = *(int *)(lVar1 + 0x3c) + 1;
      *(uint *)(lVar1 + 0x3c) = *(uint *)(lVar1 + 0x3c) & 7;
    }
    *(int *)(lVar1 + 0x38) = *(int *)(lVar1 + 0x38) + -1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_first (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  register int temp, temp2;
  register int nbits;
  register int r, k;
  int Se, Al;
  const int * natural_order;
  JBLOCKROW block;

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval)
    if (entropy->restarts_to_go == 0)
      emit_restart_e(entropy, entropy->next_restart_num);

  Se = cinfo->Se;
  Al = cinfo->Al;
  natural_order = cinfo->natural_order;

  /* Encode the MCU data block */
  block = MCU_data[0];

  /* Encode the AC coefficients per section G.1.2.2, fig. G.3 */
  
  r = 0;			/* r = run length of zeros */
   
  for (k = cinfo->Ss; k <= Se; k++) {
    if ((temp = (*block)[natural_order[k]]) == 0) {
      r++;
      continue;
    }
    /* We must apply the point transform by Al.  For AC coefficients this
     * is an integer division with rounding towards 0.  To do this portably
     * in C, we shift after obtaining the absolute value; so the code is
     * interwoven with finding the abs value (temp) and output bits (temp2).
     */
    if (temp < 0) {
      temp = -temp;		/* temp is abs value of input */
      temp >>= Al;		/* apply the point transform */
      /* For a negative coef, want temp2 = bitwise complement of abs(coef) */
      temp2 = ~temp;
    } else {
      temp >>= Al;		/* apply the point transform */
      temp2 = temp;
    }
    /* Watch out for case that nonzero coef is zero after point transform */
    if (temp == 0) {
      r++;
      continue;
    }

    /* Emit any pending EOBRUN */
    if (entropy->EOBRUN > 0)
      emit_eobrun(entropy);
    /* if run length > 15, must emit special run-length-16 codes (0xF0) */
    while (r > 15) {
      emit_ac_symbol(entropy, entropy->ac_tbl_no, 0xF0);
      r -= 16;
    }

    /* Find the number of bits needed for the magnitude of the coefficient */
    nbits = 1;			/* there must be at least one 1 bit */
    while ((temp >>= 1))
      nbits++;
    /* Check for out-of-range coefficient values */
    if (nbits > MAX_COEF_BITS)
      ERREXIT(cinfo, JERR_BAD_DCT_COEF);

    /* Count/emit Huffman symbol for run length / number of bits */
    emit_ac_symbol(entropy, entropy->ac_tbl_no, (r << 4) + nbits);

    /* Emit that number of bits of the value, if positive, */
    /* or the complement of its magnitude, if negative. */
    emit_bits_e(entropy, (unsigned int) temp2, nbits);

    r = 0;			/* reset zero run length */
  }

  if (r > 0) {			/* If there are trailing zeroes, */
    entropy->EOBRUN++;		/* count an EOB */
    if (entropy->EOBRUN == 0x7FFF)
      emit_eobrun(entropy);	/* force it out to avoid overflow */
  }

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}